

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>>::
setCountImpl<axl::sl::SimpleArrayDetails<axl::sl::Packer*>::Construct>
          (Array<axl::sl::Packer*,axl::sl::ArrayDetails<axl::sl::Packer*>> *this,size_t count)

{
  long lVar1;
  BufHdr *pBVar2;
  size_t sVar3;
  BufHdr *pBVar4;
  size_t size;
  bool bVar5;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  size = count * 8;
  lVar1 = *(long *)(this + 8);
  if ((lVar1 != 0) && (*(int *)(lVar1 + 0x10) == 1)) {
    if (*(size_t *)(this + 0x10) == count) {
      return true;
    }
    if (size <= *(ulong *)(lVar1 + 0x18)) {
      *(size_t *)(this + 0x10) = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::release
              ((ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *)this);
  }
  else {
    if (*(long *)(this + 0x10) != 0) {
      sVar3 = getAllocSize<4096ul>(size);
      pBVar4 = (BufHdr *)mem::allocate(sVar3 + 0x28);
      (pBVar4->super_RefCount).m_refCount = 0;
      (pBVar4->super_RefCount).m_weakRefCount = 1;
      (pBVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198a88;
      pBVar4->m_bufferSize = sVar3;
      pBVar4->m_flags = 0;
      (pBVar4->super_RefCount).m_freeFunc = mem::deallocate;
      rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar4);
      bVar5 = local_38.m_p != (BufHdr *)0x0;
      if (bVar5) {
        pBVar4 = local_38.m_p + 1;
        if (*(ulong *)(this + 0x10) < count) {
          size = *(ulong *)(this + 0x10) * 8;
        }
        __wrap_memcpy(pBVar4,*(void **)this,size);
        rc::RefCount::release(*(RefCount **)(this + 8));
        pBVar2 = local_38.m_p;
        *(BufHdr **)this = pBVar4;
        local_38.m_p = (BufHdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(BufHdr **)(this + 8) = pBVar2;
        *(size_t *)(this + 0x10) = count;
      }
      rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
      return bVar5;
    }
    bVar5 = Array<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::reserve
                      ((Array<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *)this,
                       count);
    if (!bVar5) {
      return false;
    }
    *(size_t *)(this + 0x10) = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}